

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::
CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
          (JavascriptLibrary *this,
          _func_void_ptr_void_ptr_void_ptr_ptr_unsigned_short_StdCallJavascriptMethodInfo_ptr_void_ptr
          *entryPoint,DynamicType *pPrototypeType)

{
  Recycler *pRVar1;
  JavascriptExternalFunction *this_00;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_49;
  TrackAllocData local_48;
  DynamicType *local_20;
  DynamicType *pPrototypeType_local;
  _func_void_ptr_void_ptr_void_ptr_ptr_unsigned_short_StdCallJavascriptMethodInfo_ptr_void_ptr
  *entryPoint_local;
  JavascriptLibrary *this_local;
  
  local_20 = pPrototypeType;
  pPrototypeType_local = (DynamicType *)entryPoint;
  entryPoint_local =
       (_func_void_ptr_void_ptr_void_ptr_ptr_unsigned_short_StdCallJavascriptMethodInfo_ptr_void_ptr
        *)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&JavascriptExternalFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1947);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this_00 = (JavascriptExternalFunction *)new<(Memory::ObjectInfoBits)1>(0x70,pRVar1,&local_49);
  JavascriptExternalFunction::JavascriptExternalFunction
            (this_00,(StdCallJavascriptMethod)pPrototypeType_local,local_20);
  return this_00;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateIdMappedExternalFunction(MethodType entryPoint, DynamicType *pPrototypeType)
    {
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptExternalFunction, entryPoint, pPrototypeType);
    }